

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNMachine<wchar_t>::import_atn_node
          (CATNMachine<wchar_t> *this,ATNMachine<wchar_t> *atn,int index,int origin,
          vector<int,_std::allocator<int>_> *node_map,int tag)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  ATNMachine<wchar_t> *atn_00;
  bool bVar2;
  ATNNodeType AVar3;
  int iVar4;
  int iVar5;
  int tag_00;
  size_type sVar6;
  reference pvVar7;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *literal;
  NFA<wchar_t> *nfa;
  Identifier *id;
  reference pvVar8;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *this_00;
  CharClass<wchar_t> local_e8;
  reference local_c8;
  ATNTransition<wchar_t> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *__range2;
  undefined4 local_a0;
  undefined4 local_9c;
  initializer_list<wchar_t> local_98;
  CharClass<wchar_t> local_88;
  CharClass<wchar_t> local_58;
  ATNNode<wchar_t> *local_38;
  ATNNode<wchar_t> *node;
  vector<int,_std::allocator<int>_> *pvStack_28;
  int tag_local;
  vector<int,_std::allocator<int>_> *node_map_local;
  int origin_local;
  int index_local;
  ATNMachine<wchar_t> *atn_local;
  CATNMachine<wchar_t> *this_local;
  
  node._4_4_ = tag;
  pvStack_28 = node_map;
  node_map_local._0_4_ = origin;
  node_map_local._4_4_ = index;
  _origin_local = atn;
  atn_local = (ATNMachine<wchar_t> *)this;
  local_38 = ATNMachine<wchar_t>::get_node(atn,index);
  sVar6 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
          ::size(&this->m_nodes);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_28,(long)node_map_local._4_4_)
  ;
  *pvVar7 = (value_type)sVar6;
  AVar3 = ATNNode<wchar_t>::type(local_38);
  switch(AVar3) {
  case Blank:
    CharClass<wchar_t>::CharClass(&local_58);
    node_map_local._0_4_ = add_node(this,&local_58,(int)node_map_local,node._4_4_);
    CharClass<wchar_t>::~CharClass(&local_58);
    break;
  case Nonterminal:
    id = ATNNode<wchar_t>::get_submachine(local_38);
    node_map_local._0_4_ = import_nonterminal(this,id,(int)node_map_local,node._4_4_);
    break;
  case LiteralTerminal:
    literal = ATNNode<wchar_t>::get_literal_abi_cxx11_(local_38);
    node_map_local._0_4_ = import_literal_terminal(this,literal,(int)node_map_local,node._4_4_);
    break;
  case RegularTerminal:
    nfa = ATNNode<wchar_t>::get_nfa(local_38);
    node_map_local._0_4_ = import_regular_terminal(this,nfa,(int)node_map_local,node._4_4_);
    break;
  case WhiteSpace:
    __range2._0_4_ = 0x20;
    __range2._4_4_ = 9;
    local_a0 = 0xd;
    local_9c = 10;
    local_98._M_array = (iterator)&__range2;
    local_98._M_len = 4;
    CharClass<wchar_t>::CharClass(&local_88,&local_98);
    node_map_local._0_4_ = import_whitespace(this,&local_88,(int)node_map_local,node._4_4_);
    CharClass<wchar_t>::~CharClass(&local_88);
  }
  pvVar8 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
           ::operator[](&this->m_nodes,(long)(int)node_map_local);
  CATNNode<wchar_t>::set_source(pvVar8,node_map_local._4_4_);
  this_00 = ATNNode<wchar_t>::get_transitions(local_38);
  __end0 = std::
           vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
           ::begin(this_00);
  tr = (ATNTransition<wchar_t> *)
       std::
       vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
       ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                                     *)&tr), bVar2) {
    local_c8 = __gnu_cxx::
               __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
               ::operator*(&__end0);
    pvVar1 = pvStack_28;
    iVar4 = ATNTransition<wchar_t>::dest(local_c8);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)iVar4);
    atn_00 = _origin_local;
    if (*pvVar7 < 0) {
      iVar5 = ATNTransition<wchar_t>::dest(local_c8);
      iVar4 = (int)node_map_local;
      pvVar1 = pvStack_28;
      tag_00 = ATNTransition<wchar_t>::tag(local_c8);
      import_atn_node(this,atn_00,iVar5,iVar4,pvVar1,tag_00);
    }
    else {
      pvVar8 = std::
               vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
               ::operator[](&this->m_nodes,(long)(int)node_map_local);
      CharClass<wchar_t>::CharClass(&local_e8);
      pvVar1 = pvStack_28;
      iVar4 = ATNTransition<wchar_t>::dest(local_c8);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)iVar4);
      iVar4 = *pvVar7;
      iVar5 = ATNTransition<wchar_t>::tag(local_c8);
      CATNNode<wchar_t>::add_transition(pvVar8,&local_e8,iVar4,iVar5);
      CharClass<wchar_t>::~CharClass(&local_e8);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void import_atn_node(const ATNMachine<TCHAR>& atn, int index, int origin, std::vector<int>& node_map, int tag)
    {
        const ATNNode<TCHAR>& node = atn.get_node(index);

        node_map[index] = m_nodes.size();

        switch (node.type())
        {
        case ATNNodeType::Blank:
            origin = add_node(CharClass<TCHAR>(), origin, tag);
            break;
        case ATNNodeType::LiteralTerminal:
            origin = import_literal_terminal(node.get_literal(), origin, tag);
            break;
        case ATNNodeType::RegularTerminal:
            origin = import_regular_terminal(node.get_nfa(), origin, tag);
            break;
        case ATNNodeType::Nonterminal:
            origin = import_nonterminal(node.get_submachine(), origin, tag);
            break;
        case ATNNodeType::WhiteSpace:
            origin = import_whitespace(CharClass<TCHAR>({u' ', u'\t', u'\r', u'\n'}), origin, tag);
            break;
        }

        m_nodes[origin].set_source(index);

        for (const auto& tr : node.get_transitions())
        {
            if (node_map[tr.dest()] < 0)
                import_atn_node(atn, tr.dest(), origin, node_map, tr.tag());
            else
                m_nodes[origin].add_transition(CharClass<TCHAR>(), node_map[tr.dest()], tr.tag());
        }
    }